

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcp_echo_server.cpp
# Opt level: O0

void __thiscall EchoServer::start(EchoServer *this)

{
  LogLevel LVar1;
  LogStream *pLVar2;
  self *this_00;
  SourceFile file;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  EchoServer *local_10;
  EchoServer *this_local;
  
  local_10 = this;
  LVar1 = sznet::Logger::logLevel();
  if ((int)LVar1 < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_ff0,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/kcp_echo/kcp_echo_server.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    sznet::Logger::Logger(&local_fe0,file,0x37);
    pLVar2 = sznet::Logger::stream(&local_fe0);
    this_00 = sznet::LogStream::operator<<(pLVar2,"starting ");
    pLVar2 = sznet::LogStream::operator<<(this_00,numThreads);
    sznet::LogStream::operator<<(pLVar2," threads.");
    sznet::Logger::~Logger(&local_fe0);
  }
  sznet::net::KcpWithTcpServer::start(&this->m_server);
  return;
}

Assistant:

void start()
    {
        LOG_INFO << "starting " << numThreads << " threads.";
        m_server.start();
    }